

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>_>
* Registry<std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
  ::all(void)

{
  size_t sVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *__ht;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<long_long,long_long,std::function<ExecutionResult(std::__cxx11::list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>const&)>>>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<long_long,long_long,std::function<ExecutionResult(std::__cxx11::list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>const&)>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *in_RDI;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>,_true>_>_>
  local_10;
  
  __ht = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)instance();
  *(undefined8 *)in_RDI = 0;
  *(size_type *)(in_RDI + 8) = __ht->_M_bucket_count;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(size_type *)(in_RDI + 0x18) = __ht->_M_element_count;
  sVar1 = (__ht->_M_rehash_policy)._M_next_resize;
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)&__ht->_M_rehash_policy;
  *(size_t *)(in_RDI + 0x28) = sVar1;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<long_long,long_long,std::function<ExecutionResult(std::__cxx11::list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>const&)>>>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<long_long,long_long,std::function<ExecutionResult(std::__cxx11::list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>const&)>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<long_long,long_long,std::function<ExecutionResult(std::__cxx11::list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>const&)>>>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<long_long,long_long,std::function<ExecutionResult(std::__cxx11::list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>const&)>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::tuple<long_long,long_long,std::function<ExecutionResult(std::__cxx11::list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>const&)>>>,true>>>>
            (in_RDI,__ht,&local_10);
  return (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>_>
          *)in_RDI;
}

Assistant:

const std::unordered_map<std::string, T> Registry<T>::all()
{
    return instance().map;
}